

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

int ggwave_ndecode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer,
                  int payloadSize)

{
  GGWave *this;
  bool bVar1;
  uint uVar2;
  long lVar3;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  bVar1 = GGWave::decode(this,waveformBuffer,waveformSize);
  if (bVar1) {
    lVar3 = __tls_get_addr(&PTR_0010ffb8);
    if (*(char *)(lVar3 + 0x28) == '\0') {
      *(undefined8 *)(lVar3 + 0x18) = 0;
      *(undefined4 *)(lVar3 + 0x20) = 0;
      *(undefined1 *)(lVar3 + 0x28) = 1;
    }
    uVar2 = GGWave::rxTakeData(this,(TxRxData *)(lVar3 + 0x18));
    if (uVar2 == 0xffffffff) {
      uVar2 = 0xffffffff;
    }
    else if (payloadSize < (int)uVar2) {
      uVar2 = 0xfffffffe;
    }
    else if (0 < (int)uVar2) {
      memcpy(payloadBuffer,((TxRxData *)(lVar3 + 0x18))->m_data,(ulong)uVar2);
    }
  }
  else {
    uVar2 = 0xffffffff;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)(uint)id);
    }
  }
  return uVar2;
}

Assistant:

int ggwave_ndecode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer,
        int payloadSize) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > payloadSize) {
        // the payloadBuffer is not big enough to store the data
        return -2;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}